

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

void insertintohashmap(vector<int,_std::allocator<int>_> *qu,int offset,int d,int tsid,int len,
                      int start)

{
  int iVar1;
  int iVar2;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  point f;
  int local_64;
  long local_60;
  key_type local_58;
  
  uVar6 = PAA_DIMENSION[d];
  local_60 = (long)tsid;
  uVar3 = 0;
  iVar2 = (int)((long)len / (long)(int)uVar6);
  uVar7 = 0;
  if (0 < iVar2) {
    uVar7 = (long)len / (long)(int)uVar6 & 0xffffffff;
  }
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  lVar4 = (long)offset * 4;
  iVar5 = offset * iVar2 + start;
  dVar11 = 0.0;
  for (; uVar9 = uVar7, iVar1 = iVar5, uVar3 != uVar8; uVar3 = uVar3 + 1) {
    while (uVar9 != 0) {
      dVar12 = (((double)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[(long)offset + uVar3] + 0.5) * bucket_w +
               min_data) -
               data_x.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_60].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar1];
      dVar11 = dVar11 + dVar12 * dVar12;
      uVar9 = uVar9 - 1;
      iVar1 = iVar1 + 1;
    }
    iVar5 = iVar5 + iVar2;
  }
  if (dVar11 / (double)len <= (double)FUZZY * bucket_w * bucket_w) {
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_64 = tsid;
    local_58.d = uVar6;
    for (lVar10 = 0; lVar10 < (int)uVar6; lVar10 = lVar10 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&local_58.f,
                 (value_type_conflict1 *)
                 ((long)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      uVar6 = PAA_DIMENSION[d];
      lVar4 = lVar4 + 4;
    }
    this = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
           std::
           map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](tree[d] + label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[local_60],&local_58);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>(this,&local_64);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  }
  return;
}

Assistant:

void insertintohashmap(vector<int> &qu, int offset, int d, int tsid, int len, int start) {
    // PAA window
    int window = len / PAA_DIMENSION[d];
    double distance = 0;
    int s_pos = start + offset * window;
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        for (int j = 0; j < window; ++j) {
            double tmp_dis = paa2ts(qu[offset + i]) - data_x[tsid][s_pos + i * window + j];
            distance += tmp_dis * tmp_dis;
        }
    }
    distance /= len;
    if (distance > bucket_w * bucket_w * FUZZY) {
        return;
    }
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    tree[d][label[tsid]][f].insert(tsid);
}